

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_gfx_vertex3f(float x,float y,float z)

{
  int *piVar1;
  int iVar2;
  rf_render_batch *prVar3;
  rf_vertex_buffer *prVar4;
  long lVar5;
  rf_gfx_vertex_data_type *prVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  rf_mat mat;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  rf_context *prVar23;
  long in_FS_OFFSET;
  rf_vec3 rVar24;
  
  prVar23 = rf__ctx;
  if ((rf__ctx->field_0).transform_matrix_required == true) {
    uVar7 = (rf__ctx->field_0).transform.m12;
    uVar20 = (rf__ctx->field_0).transform.m0;
    uVar21 = (rf__ctx->field_0).transform.m4;
    uVar22 = (rf__ctx->field_0).transform.m8;
    mat.m8 = (float)uVar22;
    mat.m4 = (float)uVar21;
    mat.m0 = (float)uVar20;
    uVar8 = (rf__ctx->field_0).transform.m1;
    uVar9 = (rf__ctx->field_0).transform.m5;
    mat.m5 = (float)uVar9;
    mat.m1 = (float)uVar8;
    uVar10 = (rf__ctx->field_0).transform.m9;
    uVar11 = (rf__ctx->field_0).transform.m13;
    mat.m13 = (float)uVar11;
    mat.m9 = (float)uVar10;
    uVar12 = (rf__ctx->field_0).transform.m2;
    uVar13 = (rf__ctx->field_0).transform.m6;
    mat.m6 = (float)uVar13;
    mat.m2 = (float)uVar12;
    uVar14 = (rf__ctx->field_0).transform.m10;
    uVar15 = (rf__ctx->field_0).transform.m14;
    mat.m14 = (float)uVar15;
    mat.m10 = (float)uVar14;
    uVar16 = (rf__ctx->field_0).transform.m3;
    uVar17 = (rf__ctx->field_0).transform.m7;
    mat.m7 = (float)uVar17;
    mat.m3 = (float)uVar16;
    uVar18 = (rf__ctx->field_0).transform.m11;
    uVar19 = (rf__ctx->field_0).transform.m15;
    mat.m15 = (float)uVar19;
    mat.m11 = (float)uVar18;
    mat.m12 = (float)uVar7;
    rVar24.y = y;
    rVar24.x = x;
    rVar24.z = z;
    rVar24 = rf_vec3_transform(rVar24,mat);
    z = rVar24.z;
    x = rVar24.x;
    y = rVar24.y;
  }
  prVar3 = (prVar23->field_0).current_batch;
  prVar4 = prVar3->vertex_buffers;
  lVar5 = prVar3->current_buffer;
  iVar2 = prVar4[lVar5].v_counter;
  if (iVar2 < prVar4[lVar5].elements_count * 4) {
    prVar6 = prVar4[lVar5].vertices;
    *(ulong *)(prVar6 + (long)iVar2 * 3) = CONCAT44(y,x);
    prVar6[(long)iVar2 * 3 + 2] = z;
    prVar4[lVar5].v_counter = iVar2 + 1;
    piVar1 = &prVar3->draw_calls[prVar3->draw_calls_counter + -1].vertex_count;
    *piVar1 = *piVar1 + 1;
  }
  else {
    rf_log_impl(8,0x1741a6,(char *)0x6);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_gfx_vertex3f";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x9ba5;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 6;
  }
  return;
}

Assistant:

RF_API void rf_gfx_vertex3f(float x, float y, float z)
{
    rf_vec3 vec = {x, y, z };

    // rf_transform provided vector if required
    if (rf_ctx.transform_matrix_required) vec = rf_vec3_transform(vec, rf_ctx.transform);

    // Verify that rf_max_batch_elements limit not reached
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter < (rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4))
    {
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter] = vec.x;
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter + 1] = vec.y;
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter + 2] = vec.z;
        rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter++;

        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count++;
    }
    else RF_LOG_ERROR(RF_LIMIT_REACHED, "Render batch elements limit reached. Max bacht elements: %d", rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4);
}